

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_exp2const(FuncState *fs,expdesc *e,TValue *v)

{
  TString *pTVar1;
  TValue *pTVar2;
  TValue *io2;
  TValue *io1;
  TString *x_;
  TValue *io;
  TValue *v_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  if (e->t == e->f) {
    switch(e->k) {
    case VNIL:
      v->tt_ = '\0';
      fs_local._4_4_ = 1;
      break;
    case VTRUE:
      v->tt_ = '\x11';
      fs_local._4_4_ = 1;
      break;
    case VFALSE:
      v->tt_ = '\x01';
      fs_local._4_4_ = 1;
      break;
    default:
      fs_local._4_4_ = tonumeral(e,v);
      break;
    case VKSTR:
      pTVar1 = (e->u).strval;
      (v->value_).gc = (GCObject *)pTVar1;
      v->tt_ = pTVar1->tt | 0x40;
      fs_local._4_4_ = 1;
      break;
    case VCONST:
      pTVar2 = const2val(fs,e);
      v->value_ = pTVar2->value_;
      v->tt_ = pTVar2->tt_;
      fs_local._4_4_ = 1;
    }
  }
  else {
    fs_local._4_4_ = 0;
  }
  return fs_local._4_4_;
}

Assistant:

int luaK_exp2const (FuncState *fs, const expdesc *e, TValue *v) {
  if (hasjumps(e))
    return 0;  /* not a constant */
  switch (e->k) {
    case VFALSE:
      setbfvalue(v);
      return 1;
    case VTRUE:
      setbtvalue(v);
      return 1;
    case VNIL:
      setnilvalue(v);
      return 1;
    case VKSTR: {
      setsvalue(fs->ls->L, v, e->u.strval);
      return 1;
    }
    case VCONST: {
      setobj(fs->ls->L, v, const2val(fs, e));
      return 1;
    }
    default: return tonumeral(e, v);
  }
}